

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::xml_document::save_file
          (xml_document *this,char *path_,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  FILE *data_;
  char *__modes;
  undefined1 local_38 [8];
  auto_deleter<_IO_FILE> file;
  xml_encoding encoding_local;
  uint flags_local;
  char_t *indent_local;
  char *path__local;
  xml_document *this_local;
  
  __modes = "wb";
  if ((flags & 0x20) != 0) {
    __modes = "w";
  }
  file.deleter._0_4_ = encoding;
  file.deleter._4_4_ = flags;
  data_ = fopen(path_,__modes);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::auto_deleter
            ((auto_deleter<_IO_FILE> *)local_38,(_IO_FILE *)data_,impl::anon_unknown_0::close_file);
  bVar1 = impl::anon_unknown_0::save_file_impl
                    (this,(FILE *)local_38,indent,file.deleter._4_4_,(xml_encoding)file.deleter);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter((auto_deleter<_IO_FILE> *)local_38);
  return bVar1;
}

Assistant:

PUGI__FN bool xml_document::save_file(const char* path_, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(fopen(path_, (flags & format_save_file_text) ? "w" : "wb"), impl::close_file);

		return impl::save_file_impl(*this, file.data, indent, flags, encoding);
	}